

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-maxpooling2d.h
# Opt level: O0

void __thiscall
dynet::MaxPooling2D::MaxPooling2D
          (MaxPooling2D *this,initializer_list<unsigned_int> *a,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *k,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *s,bool padding_type)

{
  initializer_list<unsigned_int> *in_RDI;
  byte in_R8B;
  Node *unaff_retaddr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  
  Node::Node(unaff_retaddr,in_RDI);
  in_RDI->_M_array = (iterator)&PTR__MaxPooling2D_010470e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_00000010,in_stack_00000008);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_00000010,in_stack_00000008);
  *(byte *)&in_RDI[9]._M_array = in_R8B & 1;
  return;
}

Assistant:

explicit MaxPooling2D(const std::initializer_list<VariableIndex>& a, const std::vector<unsigned>& k, const std::vector<unsigned>& s,
    const bool padding_type = true)
      : Node(a), ksize(k), stride(s), is_valid(padding_type) {}